

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetAnchorUuidBD(XrAnchorBD anchor,XrUuidEXT *uuid)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  XrAnchorBD_T *in_stack_fffffffffffffdb8;
  XrAnchorBD anchor_local;
  string local_238;
  string local_218;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  string local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3ba0b98a;
  anchor_local = anchor;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrAnchorBD_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&anchor_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrAnchorBDHandle(&anchor_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrAnchorBD_T_*>::getWithInstanceInfo(&g_anchorbd_info,anchor_local);
    XVar2 = XR_SUCCESS;
    if (uuid == (XrUuidEXT *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetAnchorUuidBD-uuid-parameter",(allocator *)&local_1b0);
      std::__cxx11::string::string
                ((string *)&local_238,"xrGetAnchorUuidBD",(allocator *)&stack0xfffffffffffffdbf);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1e0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_218,
                 "Invalid NULL for XrUuidEXT \"uuid\" which is not optional and must be non-NULL",
                 (allocator *)&stack0xfffffffffffffdbe);
      CoreValidLogMessage(pVar3.second,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_238,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1e0,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_1e0);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&oss);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrAnchorBD handle \"anchor\" ");
    HandleToHexString<XrAnchorBD_T*>(in_stack_fffffffffffffdb8);
    std::operator<<((ostream *)&oss,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::string
              ((string *)&local_238,"VUID-xrGetAnchorUuidBD-anchor-parameter",
               (allocator *)&stack0xfffffffffffffdbf);
    std::__cxx11::string::string
              ((string *)&local_218,"xrGetAnchorUuidBD",(allocator *)&stack0xfffffffffffffdbe);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_238,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_218,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c8,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrGetAnchorUuidBD(
XrAnchorBD anchor,
XrUuidEXT* uuid) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(anchor, XR_OBJECT_TYPE_ANCHOR_BD);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrAnchorBDHandle(&anchor);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrAnchorBD handle \"anchor\" ";
                oss << HandleToHexString(anchor);
                CoreValidLogMessage(nullptr, "VUID-xrGetAnchorUuidBD-anchor-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetAnchorUuidBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_anchorbd_info.getWithInstanceInfo(anchor);
        GenValidUsageXrHandleInfo *gen_anchorbd_info = info_with_instance.first;
        (void)gen_anchorbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == uuid) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetAnchorUuidBD-uuid-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetAnchorUuidBD", objects_info,
                                "Invalid NULL for XrUuidEXT \"uuid\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrGetAnchorUuidBD-uuid-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}